

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O1

amqp_rpc_reply_t *
amqp_login_inner(amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,char *vhost,
                int channel_max,int frame_max,int heartbeat,amqp_table_t *client_properties,
                timeval *timeout,amqp_sasl_method_enum sasl_method,__va_list_tag *vl)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ssize_t sVar7;
  amqp_pool_t *pool;
  undefined4 in_register_0000000c;
  amqp_time_t aVar8;
  amqp_method_number_t extraout_EDX;
  uint uVar9;
  bool bVar10;
  amqp_bytes_t aVar11;
  amqp_method_number_t replies [2];
  amqp_table_t client_capabilities_table;
  amqp_connection_tune_ok_t s;
  amqp_table_t default_table;
  amqp_time_t local_248;
  amqp_pool_t *local_240;
  amqp_method_t local_238;
  amqp_table_entry_t local_228;
  void *local_200;
  undefined8 local_1f8;
  char *local_1f0;
  void *local_1e8;
  void *local_1e0;
  amqp_table_t *local_1d8;
  char *local_1d0;
  amqp_table_t local_1c8;
  undefined1 local_1b8 [24];
  anon_union_16_15_ecedea02_for_value local_1a0;
  size_t local_190;
  void *pvStack_188;
  undefined1 *local_180;
  int64_t iStack_178;
  amqp_table_t local_168;
  amqp_frame_t local_158;
  undefined1 local_128 [56];
  undefined1 local_f0 [16];
  void *local_e0;
  void *local_d8;
  undefined1 local_c8 [16];
  void *local_b8;
  void *local_b0;
  undefined1 local_a0 [16];
  void *local_90;
  void *local_88;
  undefined1 local_78 [16];
  void *local_68;
  void *local_60;
  undefined1 local_50 [16];
  void *local_40;
  
  aVar8.time_point_ns = CONCAT44(in_register_0000000c,channel_max);
  if (((0xffff < (uint)channel_max) || (frame_max < 0)) || (0xffff < (uint)heartbeat)) {
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = -10;
    return __return_storage_ptr__;
  }
  local_1d0 = vhost;
  iVar6 = amqp_time_from_now(&local_248,timeout);
  uVar9 = heartbeat;
  if (iVar6 == 0) {
    aVar8.time_point_ns = local_248.time_point_ns;
    sVar7 = amqp_try_send(state,&send_header_inner_header,8,local_248,0);
    iVar6 = (int)sVar7;
    if (sVar7 == 8) {
      iVar6 = 0;
    }
    if (iVar6 == 0) {
      local_128._0_8_ = 0xa000a;
      aVar8.time_point_ns = local_248.time_point_ns;
      iVar6 = amqp_simple_wait_method_list
                        (state,0,(amqp_method_number_t *)local_128,local_248,&local_238);
      if (iVar6 == 0) {
        iVar6 = -6;
        if (((char)*(size_t *)local_238.decoded == '\0') &&
           (*(char *)((long)(size_t *)local_238.decoded + 1) == '\t')) {
          local_240 = (amqp_pool_t *)local_238.decoded;
          iVar6 = amqp_table_clone((amqp_table_t *)((long)local_238.decoded + 8),
                                   &state->server_properties,&state->properties_pool);
          bVar10 = false;
          if (iVar6 == 0) {
            iVar6 = sasl_mechanism_in_list(*(amqp_bytes_t *)&local_240->large_blocks,sasl_method);
            bVar10 = iVar6 != 0;
            iVar6 = -0x13;
            if (bVar10) {
              iVar6 = 0;
            }
          }
        }
        else {
          bVar10 = false;
        }
        if (bVar10) {
          pool = amqp_get_or_create_channel_pool(state,0);
          iVar6 = -1;
          if (pool == (amqp_pool_t *)0x0) {
LAB_0010aa87:
            bVar10 = false;
          }
          else {
            local_240 = pool;
            aVar11 = sasl_response(pool,sasl_method,vl);
            if (aVar11.bytes == (void *)0x0) goto LAB_0010aa87;
            local_1e8 = aVar11.bytes;
            local_1e0 = (void *)aVar11.len;
            amqp_table_construct_bool_entry
                      ((amqp_table_entry_t *)local_1b8,"authentication_failure_close",1);
            amqp_table_construct_bool_entry
                      ((amqp_table_entry_t *)local_128,"exchange_exchange_bindings",1);
            local_1c8.entries = (amqp_table_entry_t_ *)local_1b8;
            local_180 = (undefined1 *)local_128._16_8_;
            iStack_178 = local_128._24_8_;
            local_190 = local_128._0_8_;
            pvStack_188 = (void *)local_128._8_8_;
            local_1c8.num_entries = 2;
            amqp_table_construct_utf8_entry((amqp_table_entry_t *)local_128,"product","rabbitmq-c");
            amqp_table_construct_utf8_entry(&local_228,"version","0.16.0-pre");
            local_e0 = local_228.value.value.bytes.bytes;
            local_f0._0_8_ = local_228.value._0_8_;
            local_f0._8_8_ = local_228.value.value.i64;
            local_128._40_8_ = local_228.key.len;
            amqp_table_construct_utf8_entry(&local_228,"platform","Linux");
            local_b8 = local_228.value.value.bytes.bytes;
            local_c8._0_8_ = local_228.value._0_8_;
            local_c8._8_8_ = local_228.value.value.i64;
            local_d8 = (void *)local_228.key.len;
            amqp_table_construct_utf8_entry
                      (&local_228,"copyright",
                       "Copyright (c) 2007-2014 VMWare Inc, Tony Garnock-Jones, and Alan Antonuk.");
            local_90 = local_228.value.value.bytes.bytes;
            local_a0._0_8_ = local_228.value._0_8_;
            local_a0._8_8_ = local_228.value.value.i64;
            local_b0 = (void *)local_228.key.len;
            amqp_table_construct_utf8_entry
                      (&local_228,"information","See https://github.com/alanxz/rabbitmq-c");
            local_68 = local_228.value.value.bytes.bytes;
            local_78._0_8_ = local_228.value._0_8_;
            local_78._8_8_ = local_228.value.value.i64;
            local_88 = (void *)local_228.key.len;
            amqp_table_construct_table_entry(&local_228,"capabilities",&local_1c8);
            local_40 = local_228.value.value.bytes.bytes;
            local_50._0_8_ = local_228.value._0_8_;
            local_50._8_8_ = local_228.value.value.i64;
            local_60 = (void *)local_228.key.len;
            local_168.num_entries = 6;
            local_1d8 = &state->client_properties;
            aVar8.time_point_ns = (uint64_t)local_240;
            local_168.entries = (amqp_table_entry_t *)local_128;
            iVar6 = amqp_merge_capabilities(&local_168,client_properties,local_1d8,local_240);
            if (iVar6 != 0) goto LAB_0010aa87;
            local_158.payload.method.decoded = &local_228;
            local_228.key.len = *(size_t *)local_1d8;
            local_228.key.bytes._0_4_ = *(undefined4 *)&local_1d8->entries;
            local_228.key.bytes._4_4_ = *(undefined4 *)((long)&local_1d8->entries + 4);
            if (sasl_method == AMQP_SASL_METHOD_PLAIN) {
              local_228.value.value.f64 = (double)"PLAIN";
              local_228.value.kind = '\x05';
              local_228.value._1_7_ = 0;
            }
            else {
              if (sasl_method != AMQP_SASL_METHOD_EXTERNAL) {
                amqp_abort("Invalid SASL method: %d");
              }
              local_228.value.value.f64 = (double)"EXTERNAL";
              local_228.value.kind = '\b';
              local_228.value._1_7_ = 0;
            }
            local_228.value.value.bytes.bytes = local_1e0;
            local_200 = local_1e8;
            local_1f8 = 5;
            local_1f0 = "en_US";
            local_158.frame_type = '\x01';
            local_158.channel = 0;
            local_158.payload.method.id = 0xa000b;
            aVar8.time_point_ns = local_248.time_point_ns;
            iVar6 = amqp_send_frame_inner(state,&local_158,0,local_248);
            bVar10 = -1 < iVar6;
          }
          if (bVar10) {
            amqp_release_buffers(state);
            aVar8.time_point_ns = local_248.time_point_ns;
            iVar6 = amqp_simple_wait_method_list
                              (state,0,(amqp_method_number_t *)&DAT_0010e1b0,local_248,&local_238);
            if (iVar6 == 0) {
              if (local_238.id == 0xa0032) {
                local_1a0.boolean = 0;
                local_1b8._8_4_ = 0xa0032;
                local_1b8._0_4_ = AMQP_RESPONSE_SERVER_EXCEPTION;
                goto LAB_0010a7a3;
              }
              uVar1 = (ushort)*(size_t *)local_238.decoded;
              uVar3 = *(uint *)((long)(size_t *)local_238.decoded + 4);
              uVar2 = (ushort)((amqp_pool_blocklist_t *)((long)local_238.decoded + 8))->num_blocks;
              if (((uVar1 == 0) ||
                  ((uVar9 = (uint)uVar1, channel_max != 0 && (channel_max <= (int)(uint)uVar1)))) &&
                 (uVar9 = -(uint)(uVar1 == 0) | channel_max, channel_max != 0)) {
                uVar9 = channel_max;
              }
              channel_max = frame_max;
              if (uVar3 < (uint)frame_max) {
                channel_max = uVar3;
              }
              if (uVar3 == 0) {
                channel_max = frame_max;
              }
              frame_max = heartbeat;
              if ((int)(uint)uVar2 < heartbeat) {
                frame_max = (uint)uVar2;
              }
              if (uVar2 == 0) {
                frame_max = heartbeat;
              }
              aVar8.time_point_ns = (uint64_t)(frame_max & 0xffffU);
              iVar6 = amqp_tune_connection(state,uVar9 & 0xffff,channel_max,frame_max & 0xffffU);
              auVar4 = local_128._0_16_;
              if (-1 < iVar6) {
                local_128._16_8_ = local_1b8;
                local_1b8._0_2_ = (short)uVar9;
                local_1b8._8_2_ = (short)frame_max;
                local_128[0] = 1;
                auVar5 = local_128._0_16_;
                local_128._4_12_ = auVar4._4_12_;
                local_128._0_2_ = auVar5._0_2_;
                local_128._2_2_ = 0;
                auVar5 = local_128._0_16_;
                local_128._12_4_ = auVar4._12_4_;
                local_128._0_8_ = auVar5._0_8_;
                local_128._8_4_ = 0xa001f;
                aVar8.time_point_ns = local_248.time_point_ns;
                local_1b8._4_4_ = channel_max;
                iVar6 = amqp_send_frame_inner(state,(amqp_frame_t *)local_128,0,local_248);
                if (-1 < iVar6) {
                  amqp_release_buffers(state);
                  local_228.key.len = 0xa0029;
                  local_128._0_16_ = (undefined1  [16])amqp_cstring_bytes(local_1d0);
                  local_128._16_8_ = 0;
                  local_128._24_8_ = (void *)0x0;
                  local_128._32_4_ = 1;
                  simple_rpc_inner((amqp_rpc_reply_t *)local_1b8,state,0,0xa0028,
                                   (amqp_method_number_t *)&local_228,local_128,local_248);
                  frame_max = local_1b8._4_4_;
                  local_238.decoded = (void *)local_1b8._16_8_;
                  channel_max = local_1a0.decimal.value;
                  local_238._4_4_ = local_1b8._12_4_;
                  if (local_1b8._0_4_ == AMQP_RESPONSE_NORMAL) {
                    amqp_maybe_release_buffers(state);
                    local_1b8._0_4_ = AMQP_RESPONSE_NORMAL;
                    local_238.decoded = (amqp_pool_t *)0x0;
                    local_1a0.boolean = 0;
                    local_1b8._8_4_ = 0;
                  }
                  goto LAB_0010a7a3;
                }
              }
            }
          }
        }
      }
    }
  }
  (*state->socket->klass->close)(state->socket,AMQP_SC_FORCE);
  local_1b8._0_4_ = AMQP_RESPONSE_LIBRARY_EXCEPTION;
  local_238.decoded = (void *)aVar8.time_point_ns;
  local_1b8._8_4_ = extraout_EDX;
  local_238._4_4_ = uVar9;
  local_1a0.boolean = iVar6;
LAB_0010a7a3:
  __return_storage_ptr__->reply_type = local_1b8._0_4_;
  *(int *)&__return_storage_ptr__->field_0x4 = frame_max;
  (__return_storage_ptr__->reply).id = local_1b8._8_4_;
  *(undefined4 *)&(__return_storage_ptr__->reply).field_0x4 = local_238._4_4_;
  (__return_storage_ptr__->reply).decoded = local_238.decoded;
  __return_storage_ptr__->library_error = local_1a0.boolean;
  *(int *)&__return_storage_ptr__->field_0x1c = channel_max;
  return __return_storage_ptr__;
}

Assistant:

static amqp_rpc_reply_t amqp_login_inner(amqp_connection_state_t state,
                                         char const *vhost, int channel_max,
                                         int frame_max, int heartbeat,
                                         const amqp_table_t *client_properties,
                                         const struct timeval *timeout,
                                         amqp_sasl_method_enum sasl_method,
                                         va_list vl) {
  int res;
  amqp_method_t method;

  uint16_t client_channel_max;
  uint32_t client_frame_max;
  uint16_t client_heartbeat;

  uint16_t server_channel_max;
  uint32_t server_frame_max;
  uint16_t server_heartbeat;

  amqp_rpc_reply_t result;
  amqp_time_t deadline;

  if (channel_max < 0 || channel_max > UINT16_MAX) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }
  client_channel_max = (uint16_t)channel_max;

  if (frame_max < 0) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }
  client_frame_max = (uint32_t)frame_max;

  if (heartbeat < 0 || heartbeat > UINT16_MAX) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }
  client_heartbeat = (uint16_t)heartbeat;

  res = amqp_time_from_now(&deadline, timeout);
  if (AMQP_STATUS_OK != res) {
    goto error_res;
  }

  res = send_header_inner(state, deadline);
  if (AMQP_STATUS_OK != res) {
    goto error_res;
  }

  res = simple_wait_method_inner(state, 0, AMQP_CONNECTION_START_METHOD,
                                 deadline, &method);
  if (AMQP_STATUS_OK != res) {
    goto error_res;
  }

  {
    amqp_connection_start_t *s = (amqp_connection_start_t *)method.decoded;
    if ((s->version_major != AMQP_PROTOCOL_VERSION_MAJOR) ||
        (s->version_minor != AMQP_PROTOCOL_VERSION_MINOR)) {
      res = AMQP_STATUS_INCOMPATIBLE_AMQP_VERSION;
      goto error_res;
    }

    res = amqp_table_clone(&s->server_properties, &state->server_properties,
                           &state->properties_pool);

    if (AMQP_STATUS_OK != res) {
      goto error_res;
    }

    /* TODO: check that our chosen SASL mechanism is in the list of
       acceptable mechanisms. Or even let the application choose from
       the list! */
    if (!sasl_mechanism_in_list(s->mechanisms, sasl_method)) {
      res = AMQP_STATUS_BROKER_UNSUPPORTED_SASL_METHOD;
      goto error_res;
    }
  }

  {
    amqp_table_entry_t default_properties[6];
    amqp_table_t default_table;
    amqp_table_entry_t client_capabilities[2];
    amqp_table_t client_capabilities_table;
    amqp_connection_start_ok_t s;
    amqp_pool_t *channel_pool;
    amqp_bytes_t response_bytes;

    channel_pool = amqp_get_or_create_channel_pool(state, 0);
    if (NULL == channel_pool) {
      res = AMQP_STATUS_NO_MEMORY;
      goto error_res;
    }

    response_bytes = sasl_response(channel_pool, sasl_method, vl);
    if (response_bytes.bytes == NULL) {
      res = AMQP_STATUS_NO_MEMORY;
      goto error_res;
    }

    client_capabilities[0] =
        amqp_table_construct_bool_entry("authentication_failure_close", 1);
    client_capabilities[1] =
        amqp_table_construct_bool_entry("exchange_exchange_bindings", 1);

    client_capabilities_table.entries = client_capabilities;
    client_capabilities_table.num_entries =
        sizeof(client_capabilities) / sizeof(amqp_table_entry_t);

    default_properties[0] =
        amqp_table_construct_utf8_entry("product", "rabbitmq-c");
    default_properties[1] =
        amqp_table_construct_utf8_entry("version", AMQP_VERSION_STRING);
    default_properties[2] =
        amqp_table_construct_utf8_entry("platform", AMQ_PLATFORM);
    default_properties[3] =
        amqp_table_construct_utf8_entry("copyright", AMQ_COPYRIGHT);
    default_properties[4] = amqp_table_construct_utf8_entry(
        "information", "See https://github.com/alanxz/rabbitmq-c");
    default_properties[5] = amqp_table_construct_table_entry(
        "capabilities", &client_capabilities_table);

    default_table.entries = default_properties;
    default_table.num_entries =
        sizeof(default_properties) / sizeof(amqp_table_entry_t);

    res = amqp_merge_capabilities(&default_table, client_properties,
                                  &state->client_properties, channel_pool);
    if (AMQP_STATUS_OK != res) {
      goto error_res;
    }

    s.client_properties = state->client_properties;
    s.mechanism = sasl_method_name(sasl_method);
    s.response = response_bytes;
    s.locale = amqp_literal_bytes("en_US");

    res = amqp_send_method_inner(state, 0, AMQP_CONNECTION_START_OK_METHOD, &s,
                                 AMQP_SF_NONE, deadline);
    if (res < 0) {
      goto error_res;
    }
  }

  amqp_release_buffers(state);

  {
    amqp_method_number_t expected[] = {AMQP_CONNECTION_TUNE_METHOD,
                                       AMQP_CONNECTION_CLOSE_METHOD, 0};

    res = amqp_simple_wait_method_list(state, 0, expected, deadline, &method);
    if (AMQP_STATUS_OK != res) {
      goto error_res;
    }
  }

  if (AMQP_CONNECTION_CLOSE_METHOD == method.id) {
    result.reply_type = AMQP_RESPONSE_SERVER_EXCEPTION;
    result.reply = method;
    result.library_error = 0;
    goto out;
  }

  {
    amqp_connection_tune_t *s = (amqp_connection_tune_t *)method.decoded;
    server_channel_max = s->channel_max;
    server_frame_max = s->frame_max;
    server_heartbeat = s->heartbeat;
  }

  if (server_channel_max != 0 &&
      (server_channel_max < client_channel_max || client_channel_max == 0)) {
    client_channel_max = server_channel_max;
  } else if (server_channel_max == 0 && client_channel_max == 0) {
    client_channel_max = UINT16_MAX;
  }

  if (server_frame_max != 0 && server_frame_max < client_frame_max) {
    client_frame_max = server_frame_max;
  }

  if (server_heartbeat != 0 && server_heartbeat < client_heartbeat) {
    client_heartbeat = server_heartbeat;
  }

  res = amqp_tune_connection(state, client_channel_max, client_frame_max,
                             client_heartbeat);
  if (res < 0) {
    goto error_res;
  }

  {
    amqp_connection_tune_ok_t s;
    s.frame_max = client_frame_max;
    s.channel_max = client_channel_max;
    s.heartbeat = client_heartbeat;

    res = amqp_send_method_inner(state, 0, AMQP_CONNECTION_TUNE_OK_METHOD, &s,
                                 AMQP_SF_NONE, deadline);
    if (res < 0) {
      goto error_res;
    }
  }

  amqp_release_buffers(state);

  {
    amqp_method_number_t replies[] = {AMQP_CONNECTION_OPEN_OK_METHOD, 0};
    amqp_connection_open_t s;
    s.virtual_host = amqp_cstring_bytes(vhost);
    s.capabilities = amqp_empty_bytes;
    s.insist = 1;

    result = simple_rpc_inner(state, 0, AMQP_CONNECTION_OPEN_METHOD, replies,
                              &s, deadline);
    if (result.reply_type != AMQP_RESPONSE_NORMAL) {
      goto out;
    }
  }

  result.reply_type = AMQP_RESPONSE_NORMAL;
  result.reply.id = 0;
  result.reply.decoded = NULL;
  result.library_error = 0;
  amqp_maybe_release_buffers(state);

out:
  return result;

error_res:
  amqp_socket_close(state->socket, AMQP_SC_FORCE);
  result = amqp_rpc_reply_error(res);

  goto out;
}